

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithread.c
# Opt level: O0

void process_midi(PtTimestamp timestamp,void *userData)

{
  int iVar1;
  uint local_30;
  int data2;
  int data1;
  int status;
  int32_t msg;
  PmEvent buffer;
  PmError result;
  void *userData_local;
  PtTimestamp timestamp_local;
  
  unique0x10000120 = userData;
  if (active != 0) {
    do {
      buffer.message = Pm_Dequeue(main_to_midi,&data1);
      if (buffer.message != pmNoData) {
        if ((data1 < -0x7f) || (0x7f < data1)) {
          if (data1 == 1000) {
            Pm_Enqueue(midi_to_main,&data1);
            active = 0;
            return;
          }
          if (data1 == 0x3e9) {
            monitor = 1;
          }
          else if (data1 == 0x3ea) {
            midi_thru = (int)((midi_thru != 0 ^ 0xffU) & 1);
          }
        }
        else {
          transpose = data1;
        }
      }
    } while (buffer.message != pmNoData);
    buffer.message = 0;
    do {
      buffer.message = Pm_Poll(midi_in);
      if ((buffer.message != pmNoData) &&
         (iVar1 = Pm_Read(midi_in,(PmEvent *)&status,1), iVar1 != -0x270c)) {
        if (midi_thru != 0) {
          Pm_Write(midi_out,(PmEvent *)&status,1);
        }
        data2 = status & 0xff;
        local_30 = status >> 8 & 0xff;
        if (((status & 0xf0U) == 0x90) || ((status & 0xf0U) == 0x80)) {
          for (local_30 = transpose + local_30; 0x7f < (int)local_30; local_30 = local_30 - 0xc) {
          }
          for (; (int)local_30 < 0; local_30 = local_30 + 0xc) {
          }
          status = (status >> 0x10 & 0xffU) << 0x10 | (local_30 & 0xff) << 8 | data2;
          Pm_Write(midi_out,(PmEvent *)&status,1);
          if (monitor != 0) {
            Pm_Enqueue(midi_to_main,&local_30);
            monitor = 0;
          }
        }
      }
    } while (buffer.message != 0);
  }
  return;
}

Assistant:

void process_midi(PtTimestamp timestamp, void *userData)
{
    PmError result;
    PmEvent buffer; /* just one message at a time */
    int32_t msg;

    /* do nothing until initialization completes */
    if (!active) 
        return;

    /* check for messages */
    do { 
        result = Pm_Dequeue(main_to_midi, &msg); 
        if (result) {
            if (msg >= -127 && msg <= 127) 
                transpose = msg;
            else if (msg == QUIT_MSG) {
                /* acknowledge receipt of quit message */
                Pm_Enqueue(midi_to_main, &msg);
                active = FALSE;
                return;
            } else if (msg == MONITOR_MSG) {
                /* main has requested a pitch. monitor is a flag that
                 * records the request:
                 */
                monitor = TRUE;
            } else if (msg == THRU_MSG) {
                /* toggle Thru on or off */
                midi_thru = !midi_thru;
            }
        }
    } while (result);         
    
    /* see if there is any midi input to process */
    do {
		result = Pm_Poll(midi_in);
        if (result) {
            int status, data1, data2;
            if (Pm_Read(midi_in, &buffer, 1) == pmBufferOverflow) 
                continue;
            if (midi_thru) 
                Pm_Write(midi_out, &buffer, 1);
            /* unless there was overflow, we should have a message now */
            status = Pm_MessageStatus(buffer.message);
            data1 = Pm_MessageData1(buffer.message);
            data2 = Pm_MessageData2(buffer.message);
            if ((status & 0xF0) == 0x90 ||
                (status & 0xF0) == 0x80) {
                
                /* this is a note-on or note-off, so transpose and send */
                data1 += transpose;
                
                /* keep within midi pitch range, keep proper pitch class */
                while (data1 > 127) 
                    data1 -= 12;
                while (data1 < 0) 
                    data1 += 12;
                
                /* send the message */
                buffer.message = Pm_Message(status, data1, data2);
                Pm_Write(midi_out, &buffer, 1);
                
                /* if monitor is set, send the pitch to the main thread */
                if (monitor) {
                    Pm_Enqueue(midi_to_main, &data1);
                    monitor = FALSE; /* only send one pitch per request */
                }
            }
        }
    } while (result);
}